

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampParameterTextureBorderColor.cpp
# Opt level: O2

bool __thiscall
glcts::TextureBorderClampParameterTextureBorderColor::verifyGLGetSamplerParameterIivResult
          (TextureBorderClampParameterTextureBorderColor *this,GLuint sampler_id,GLenum target,
          GLint *expected_data)

{
  ostringstream *this_00;
  ulong uVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  GLuint j;
  long lVar6;
  vector<int,_std::allocator<int>_> buffer;
  string local_500 [32];
  string local_4e0 [32];
  stringstream expectedDataStream;
  undefined1 local_4b0 [376];
  stringstream returnedDataStream;
  undefined1 local_328 [376];
  undefined1 local_1b0 [384];
  
  std::vector<int,_std::allocator<int>_>::vector(&buffer,4,(allocator_type *)&expectedDataStream);
  std::__cxx11::stringstream::stringstream((stringstream *)&expectedDataStream);
  std::__cxx11::stringstream::stringstream((stringstream *)&returnedDataStream);
  iVar2 = (*((this->super_TextureBorderClampBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[0] =
       0;
  buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[1] =
       0;
  buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[2] =
       0;
  buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[3] =
       0;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0xa38))
            (sampler_id,
             (this->super_TextureBorderClampBase).super_TestCaseBase.m_glExtTokens.
             TEXTURE_BORDER_COLOR,
             buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"Error getting  parameter for sampler.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampParameterTextureBorderColor.cpp"
                  ,0x203);
  uVar1 = 0;
  do {
    uVar5 = uVar1;
    if (uVar5 == 4) goto LAB_00d2a2bf;
    uVar1 = uVar5 + 1;
  } while (expected_data[uVar5] ==
           buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar5]);
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<(local_4b0,expected_data[lVar6]);
    std::operator<<(poVar3,",");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (local_328,
                        buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar6]);
    std::operator<<(poVar3,",");
  }
  local_1b0._0_8_ =
       ((this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,
                  "Wrong value encountered when calling glGetSamplerParameterIivEXT() with GL_TEXTURE_BORDER_COLOR_EXT pname;"
                 );
  std::operator<<((ostream *)this_00," texture target:");
  pcVar4 = TextureBorderClampBase::getTexTargetString(&this->super_TextureBorderClampBase,target);
  std::operator<<((ostream *)this_00,pcVar4);
  std::operator<<((ostream *)this_00,"\n");
  std::operator<<((ostream *)this_00," expected values:[");
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)this_00,local_4e0);
  std::operator<<((ostream *)this_00,"]");
  std::operator<<((ostream *)this_00," result values:[");
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)this_00,local_500);
  std::operator<<((ostream *)this_00,"]\n");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string(local_500);
  std::__cxx11::string::~string(local_4e0);
  std::__cxx11::ostringstream::~ostringstream(this_00);
LAB_00d2a2bf:
  std::__cxx11::stringstream::~stringstream((stringstream *)&returnedDataStream);
  std::__cxx11::stringstream::~stringstream((stringstream *)&expectedDataStream);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&buffer.super__Vector_base<int,_std::allocator<int>_>);
  return 3 < uVar5;
}

Assistant:

bool TextureBorderClampParameterTextureBorderColor::verifyGLGetSamplerParameterIivResult(
	glw::GLuint sampler_id, glw::GLenum target, const glw::GLint* expected_data)
{
	std::vector<glw::GLint> buffer(m_buffer_length);
	std::stringstream		expectedDataStream;
	std::stringstream		returnedDataStream;
	const glw::Functions&   gl = m_context.getRenderContext().getFunctions();

	memset(&buffer[0], 0, m_buffer_length * sizeof(glw::GLint));

	gl.getSamplerParameterIiv(sampler_id, m_glExtTokens.TEXTURE_BORDER_COLOR, &buffer[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting  parameter for sampler.");

	for (glw::GLuint i = 0; i < m_buffer_length; ++i)
	{
		if (expected_data[i] != buffer[i])
		{
			for (glw::GLuint j = 0; j < m_buffer_length; ++j)
			{
				expectedDataStream << expected_data[j] << ",";
				returnedDataStream << buffer[j] << ",";
			}
			getTestContext().getLog() << tcu::TestLog::Message
									  << "Wrong value encountered when calling glGetSamplerParameterIivEXT() with "
										 "GL_TEXTURE_BORDER_COLOR_EXT pname;"
									  << " texture target:" << getTexTargetString(target) << "\n"
									  << " expected values:[" << expectedDataStream.str() << "]"
									  << " result values:[" << returnedDataStream.str() << "]\n"
									  << tcu::TestLog::EndMessage;
			return false;
		}
	}
	return true;
}